

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

NodeKind __thiscall llvm::yaml::Input::getNodeKind(Input *this)

{
  uint uVar1;
  HNode *pHVar2;
  bool bVar3;
  NodeKind NVar4;
  
  bVar3 = isa_impl_wrap<llvm::yaml::Input::ScalarHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
          ::doit(&this->CurrentNode);
  if (bVar3) {
    NVar4 = Scalar;
  }
  else {
    pHVar2 = this->CurrentNode;
    if (pHVar2 == (HNode *)0x0) {
      __assert_fail("Val && \"isa<> used on a null pointer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                    ,0x69,
                    "static bool llvm::isa_impl_cl<llvm::yaml::Input::MapHNode, const llvm::yaml::Input::HNode *>::doit(const From *) [To = llvm::yaml::Input::MapHNode, From = const llvm::yaml::Input::HNode *]"
                   );
    }
    uVar1 = pHVar2->_node->TypeID;
    NVar4 = Map;
    if (uVar1 != 4) {
      if (uVar1 != 5) {
        llvm_unreachable_internal
                  ("Unsupported node kind",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                   ,0x16b);
      }
      NVar4 = Sequence;
    }
  }
  return NVar4;
}

Assistant:

NodeKind Input::getNodeKind() {
  if (isa<ScalarHNode>(CurrentNode))
    return NodeKind::Scalar;
  else if (isa<MapHNode>(CurrentNode))
    return NodeKind::Map;
  else if (isa<SequenceHNode>(CurrentNode))
    return NodeKind::Sequence;
  llvm_unreachable("Unsupported node kind");
}